

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::DeadCodeVarElimination::remove_var(Var *var)

{
  bool bVar1;
  int iVar2;
  VarType VVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  element_type *peVar5;
  Var **ppVVar6;
  Var *left;
  shared_ptr<kratos::AssignStmt> *stmt_1;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range2_1;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sinks;
  Var *right;
  shared_ptr<kratos::AssignStmt> *stmt;
  iterator __end2;
  iterator __begin2;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range2;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sources;
  Generator *generator;
  Var *var_local;
  
  iVar2 = (*(var->super_IRNode)._vptr_IRNode[0xd])();
  sources._M_h._M_single_bucket = (__node_base_ptr)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(var->super_IRNode)._vptr_IRNode[0x10])();
  std::
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   *)&__range2,
                  (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   *)CONCAT44(extraout_var_00,iVar2));
  __end2 = std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)&__range2);
  stmt = (shared_ptr<kratos::AssignStmt> *)
         std::
         unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
         ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)&__range2);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                       ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)&stmt);
    if (!bVar1) break;
    p_Var4 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::__detail::_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
             operator*(&__end2);
    peVar5 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var4);
    ppVVar6 = AssignStmt::right(peVar5);
    (*((*ppVVar6)->super_IRNode)._vptr_IRNode[0xf])(*ppVVar6,p_Var4);
    (*(var->super_IRNode)._vptr_IRNode[0x13])(var,p_Var4);
    peVar5 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var4);
    (*(peVar5->super_Stmt).super_IRNode._vptr_IRNode[9])();
    std::__detail::_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator++
              (&__end2);
  }
  iVar2 = (*(var->super_IRNode)._vptr_IRNode[0xe])();
  std::
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   *)&__range2_1,
                  (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   *)CONCAT44(extraout_var_01,iVar2));
  __end2_1 = std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)&__range2_1);
  stmt_1 = (shared_ptr<kratos::AssignStmt> *)
           std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                  *)&__range2_1);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2_1.
                        super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>,
                       (_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)&stmt_1);
    if (!bVar1) break;
    p_Var4 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::__detail::_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
             operator*(&__end2_1);
    peVar5 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var4);
    ppVVar6 = AssignStmt::left(peVar5);
    (*((*ppVVar6)->super_IRNode)._vptr_IRNode[0x13])(*ppVVar6,p_Var4);
    (*(var->super_IRNode)._vptr_IRNode[0xf])(var,p_Var4);
    peVar5 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var4);
    (*(peVar5->super_Stmt).super_IRNode._vptr_IRNode[9])();
    std::__detail::_Node_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator++
              (&__end2_1);
  }
  VVar3 = Var::type(var);
  if (VVar3 == PortIO) {
    Generator::remove_port((Generator *)sources._M_h._M_single_bucket,&var->name);
  }
  else {
    Generator::remove_var((Generator *)sources._M_h._M_single_bucket,&var->name);
  }
  std::
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::~unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)&__range2_1);
  std::
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::~unordered_set((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)&__range2);
  return;
}

Assistant:

static void remove_var(Var* var) {
        auto* generator = var->generator();

        auto sources = std::unordered_set<std::shared_ptr<AssignStmt>>(var->sources());
        for (auto const& stmt : sources) {
            auto* right = stmt->right();
            right->remove_sink(stmt);
            var->remove_source(stmt);
            stmt->remove_from_parent();
        }

        auto sinks = std::unordered_set<std::shared_ptr<AssignStmt>>(var->sinks());
        for (auto const& stmt : sinks) {
            auto* left = stmt->left();
            left->remove_source(stmt);
            var->remove_sink(stmt);
            stmt->remove_from_parent();
        }

        if (var->type() == VarType::PortIO) {
            generator->remove_port(var->name);
        } else {
            generator->remove_var(var->name);
        }
    }